

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

uint FillFlags(uint flags)

{
  uint uVar1;
  long in_FS_OFFSET;
  bool local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = flags * 8 & 0x800;
  uVar1 = (uVar1 | flags & 0x800) >> 0xb | uVar1 | flags;
  local_11 = IsValidFlagCombination(uVar1);
  inline_assertion_check<true,bool>
            (&local_11,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
             ,0xac,"FillFlags","IsValidFlagCombination(flags)");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int FillFlags(unsigned int flags)
{
    // CLEANSTACK implies WITNESS
    if (flags & SCRIPT_VERIFY_CLEANSTACK) flags |= SCRIPT_VERIFY_WITNESS;

    // WITNESS implies P2SH (and transitively CLEANSTACK implies P2SH)
    if (flags & SCRIPT_VERIFY_WITNESS) flags |= SCRIPT_VERIFY_P2SH;
    Assert(IsValidFlagCombination(flags));
    return flags;
}